

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::setupViewport(QGraphicsView *this,QWidget *widget)

{
  bool bVar1;
  byte bVar2;
  QGraphicsViewPrivate *pQVar3;
  QWidgetPrivate *pQVar4;
  QGraphicsScenePrivate *pQVar5;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  GestureType gesture;
  QList<Qt::GestureType> *__range2;
  bool isGLWidget;
  QGraphicsViewPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  QList<Qt::GestureType> gestures;
  undefined4 in_stack_ffffffffffffff48;
  FocusPolicy in_stack_ffffffffffffff4c;
  undefined1 uVar6;
  QWidget *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  QWidget *pQVar7;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  QHash<Qt::GestureType,_int> *in_stack_ffffffffffffff78;
  undefined1 local_5c [4];
  GestureType *local_58;
  undefined8 in_stack_ffffffffffffffb0;
  const_iterator cVar8;
  const_iterator in_stack_ffffffffffffffb8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QGraphicsView *)0xa3bee5);
  if (in_RSI == (QWidget *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QMessageLogger::warning(local_28,"QGraphicsView::setupViewport: cannot initialize null widget");
    goto LAB_00a3c206;
  }
  bVar1 = QObject::inherits(&in_stack_ffffffffffffff50->super_QObject,
                            (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  uVar6 = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  *(uint *)&pQVar3->field_0x300 =
       *(uint *)&pQVar3->field_0x300 & 0xffffffbf | (uint)((bVar1 ^ 0xffU) & 1) << 6;
  QWidget::setFocusPolicy(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  if (bVar1) {
    pQVar4 = QWidgetPrivate::get((QWidget *)0xa3bf81);
    bVar2 = (**(code **)(*(long *)pQVar4 + 0x98))();
    pQVar3->stereoEnabled = (bool)(bVar2 & 1);
  }
  else {
    QWidget::setAutoFillBackground
              ((QWidget *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),(bool)uVar6)
    ;
  }
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3bfc4);
  if (bVar1) {
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3bfdb);
    pQVar5 = QGraphicsScene::d_func((QGraphicsScene *)0xa3bfe3);
    if ((*(uint *)&pQVar5->field_0xb8 >> 0xc & 1) != 0) {
      QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3c005);
      pQVar5 = QGraphicsScene::d_func((QGraphicsScene *)0xa3c00d);
      if ((*(uint *)&pQVar5->field_0xb8 >> 0xd & 1) != 0) goto LAB_00a3c01e;
    }
LAB_00a3c03a:
    QWidget::setMouseTracking(in_stack_ffffffffffffff50,SUB41(in_stack_ffffffffffffff4c >> 0x18,0));
  }
  else {
LAB_00a3c01e:
    if ((pQVar3->transformationAnchor == AnchorUnderMouse) ||
       (pQVar3->resizeAnchor == AnchorUnderMouse)) goto LAB_00a3c03a;
  }
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3c05a);
  if (bVar1) {
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3c071);
    pQVar5 = QGraphicsScene::d_func((QGraphicsScene *)0xa3c079);
    if ((*(uint *)&pQVar5->field_0xb8 >> 0x10 & 1) == 0) {
      QWidget::setAttribute
                ((QWidget *)in_stack_ffffffffffffffb8.i,
                 (WidgetAttribute)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x18,0));
    }
  }
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3c0af);
  uVar6 = (undefined1)(in_stack_ffffffffffffff4c >> 0x18);
  if (bVar1) {
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3c0f3);
    QGraphicsScene::d_func((QGraphicsScene *)0xa3c0fb);
    QHash<Qt::GestureType,_int>::keys(in_stack_ffffffffffffff78);
    QList<Qt::GestureType>::begin((QList<Qt::GestureType> *)in_stack_ffffffffffffff50);
    local_58 = (GestureType *)
               QList<Qt::GestureType>::end((QList<Qt::GestureType> *)in_stack_ffffffffffffff50);
    while( true ) {
      cVar8.i = local_58;
      bVar1 = QList<Qt::GestureType>::const_iterator::operator!=
                        ((const_iterator *)&stack0xffffffffffffffb8,(const_iterator)local_58);
      uVar6 = (undefined1)(in_stack_ffffffffffffff4c >> 0x18);
      if (!bVar1) break;
      QList<Qt::GestureType>::const_iterator::operator*((const_iterator *)&stack0xffffffffffffffb8);
      pQVar7 = in_RSI;
      memset(local_5c,0,4);
      QFlags<Qt::GestureFlag>::QFlags((QFlags<Qt::GestureFlag> *)0xa3c1ba);
      QWidget::grabGesture
                (in_stack_ffffffffffffff50,(GestureType)pQVar7,
                 (QFlagsStorageHelper<Qt::GestureFlag,_4>)SUB84((ulong)pQVar7 >> 0x20,0));
      QList<Qt::GestureType>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffffb8)
      ;
      local_58 = cVar8.i;
    }
    QList<Qt::GestureType>::~QList((QList<Qt::GestureType> *)0xa3c1e2);
  }
  QWidget::acceptDrops((QWidget *)0xa3c1f6);
  QWidget::setAcceptDrops(in_RSI,(bool)uVar6);
LAB_00a3c206:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::setupViewport(QWidget *widget)
{
    Q_D(QGraphicsView);

    if (!widget) {
        qWarning("QGraphicsView::setupViewport: cannot initialize null widget");
        return;
    }

    const bool isGLWidget = widget->inherits("QOpenGLWidget");

    d->accelerateScrolling = !(isGLWidget);

    widget->setFocusPolicy(Qt::StrongFocus);

    if (isGLWidget)
        d->stereoEnabled = QWidgetPrivate::get(widget)->isStereoEnabled();

    if (!isGLWidget) {
        // autoFillBackground enables scroll acceleration.
        widget->setAutoFillBackground(true);
    }

    // We are only interested in mouse tracking if items
    // accept hover events or use non-default cursors or if
    // AnchorUnderMouse is used as transformation or resize anchor.
    if ((d->scene && (!d->scene->d_func()->allItemsIgnoreHoverEvents
                     || !d->scene->d_func()->allItemsUseDefaultCursor))
        || d->transformationAnchor == AnchorUnderMouse
        || d->resizeAnchor == AnchorUnderMouse) {
        widget->setMouseTracking(true);
    }

    // enable touch events if any items is interested in them
    if (d->scene && !d->scene->d_func()->allItemsIgnoreTouchEvents)
        widget->setAttribute(Qt::WA_AcceptTouchEvents);

#ifndef QT_NO_GESTURES
    if (d->scene) {
        const auto gestures = d->scene->d_func()->grabbedGestures.keys();
        for (Qt::GestureType gesture : gestures)
            widget->grabGesture(gesture);
    }
#endif

    widget->setAcceptDrops(acceptDrops());
}